

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockNamedValueHandlerRepository_installCopier_Test::testBody
          (TEST_MockNamedValueHandlerRepository_installCopier_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueCopier *pMVar2;
  TestTerminator *pTVar3;
  TypeForTestingExpectedFunctionCallCopier copier;
  MockNamedValueComparatorsAndCopiersRepository repository;
  SimpleString local_38;
  MockNamedValueCopier local_28;
  MockNamedValueComparatorsAndCopiersRepository local_20;
  
  local_28._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002b6978;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_20);
  SimpleString::SimpleString(&local_38,"typeName");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_20,&local_38,&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"typeName");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_20,&local_38);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_28,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x78,pTVar3);
  SimpleString::~SimpleString(&local_38);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_20);
  return;
}

Assistant:

virtual void copy(void* dst_, const void* src_) _override
    {
        TypeForTestingExpectedFunctionCall* dst = (TypeForTestingExpectedFunctionCall*) dst_;
        const TypeForTestingExpectedFunctionCall* src = (const TypeForTestingExpectedFunctionCall*) src_;
        *(dst->value) = *(src->value);
    }